

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitI31New
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::PrecomputingExpressionRunner> *this,
          I31New *curr)

{
  bool bVar1;
  int32_t value_00;
  Literal local_98;
  Literal *local_80;
  Literal *value;
  undefined1 local_68 [8];
  Flow flow;
  I31New *curr_local;
  ExpressionRunner<wasm::PrecomputingExpressionRunner> *this_local;
  
  flow.breakTo.super_IString.str._M_str = (char *)curr;
  visit((Flow *)local_68,this,curr->value);
  bVar1 = Flow::breaking((Flow *)local_68);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
  }
  else {
    local_80 = Flow::getSingleValue((Flow *)local_68);
    value_00 = wasm::Literal::geti32(local_80);
    wasm::Literal::makeI31(&local_98,value_00);
    Flow::Flow(__return_storage_ptr__,&local_98);
    wasm::Literal::~Literal(&local_98);
  }
  value._0_4_ = 1;
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitI31New(I31New* curr) {
    NOTE_ENTER("I31New");
    Flow flow = visit(curr->value);
    if (flow.breaking()) {
      return flow;
    }
    const auto& value = flow.getSingleValue();
    NOTE_EVAL1(value);
    return Literal::makeI31(value.geti32());
  }